

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiplyexpression.cpp
# Opt level: O3

void __thiscall MultiplyExpression::interpret(MultiplyExpression *this,Context *context)

{
  int iVar1;
  string *psVar2;
  size_t sVar3;
  char buf [64];
  long *local_88 [2];
  long local_78 [2];
  long *local_68 [2];
  long local_58 [7];
  
  (*context->_vptr_Context[2])(local_68);
  iVar1 = atoi((char *)local_68[0]);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  sprintf((char *)local_68,"%d",(ulong)(uint)(iVar1 * this->_muled));
  psVar2 = (string *)operator_new(0x20);
  *(string **)psVar2 = psVar2 + 0x10;
  sVar3 = strlen((char *)local_68);
  std::__cxx11::string::_M_construct<char_const*>(psVar2,local_68,(long)local_68 + sVar3);
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,*(long *)psVar2,*(long *)(psVar2 + 8) + *(long *)psVar2);
  (*context->_vptr_Context[3])(context,local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  return;
}

Assistant:

void MultiplyExpression::interpret(Context& context)
{
	int num = atoi(context.data().c_str());
	char buf[64];

	num *= _muled;

	sprintf(buf, "%d", num);

	context.setData(*(new string(buf)));
}